

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall
RTree::DFT_recursive
          (RTree *this,Point q,int k,RTree_node *node,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L
          ,vector<float,_std::allocator<float>_> *ddk,float *poor)

{
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  ulong __new_size;
  float fVar3;
  float local_6c;
  vector<float,_std::allocator<float>_> branch_value;
  vector<RTree_node_*,_std::allocator<RTree_node_*>_> branch;
  
  if (node->is_leaf == true) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < node->elements; lVar2 = lVar2 + 1) {
      fVar3 = Polygon::distance_geometric
                        (*(Polygon **)
                          ((long)&((node->data_leafs).
                                   super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                   super__Vector_impl_data._M_start)->region + lVar1),q);
      branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)CONCAT44(branch_value.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,fVar3);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(ddk,(float *)&branch_value);
      branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)((long)&((node->data_leafs).
                                    super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                    super__Vector_impl_data._M_start)->polygon + lVar1);
      std::vector<d_leaf*,std::allocator<d_leaf*>>::emplace_back<d_leaf*>
                ((vector<d_leaf*,std::allocator<d_leaf*>> *)L,(d_leaf **)&branch_value);
      lVar1 = lVar1 + 0x10;
    }
    __new_size = (ulong)k;
    if (__new_size <
        (ulong)((long)(ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      insert_sort<d_leaf>(this,ddk,L);
      std::vector<float,_std::allocator<float>_>::resize(ddk,__new_size);
      std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::resize(L,__new_size);
      *poor = (ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[__new_size - 1];
    }
  }
  else {
    branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar1 = 8;
    for (lVar2 = 0; lVar2 < node->elements; lVar2 = lVar2 + 1) {
      local_6c = Polygon::distance_geometric
                           (*(Polygon **)
                             ((long)(node->data_internal_node).
                                    super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar1 + -8),q);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(&branch_value,&local_6c);
      std::vector<RTree_node_*,_std::allocator<RTree_node_*>_>::push_back
                (&branch,(value_type *)
                         ((long)&((node->data_internal_node).
                                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->region + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    insert_sort<RTree_node>(this,&branch_value,&branch);
    for (lVar1 = 0; lVar1 < node->elements; lVar1 = lVar1 + 1) {
      if (branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] <= *poor) {
        DFT_recursive(this,q,k,branch.
                               super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar1],L,ddk,poor);
      }
    }
    std::_Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>::~_Vector_base
              (&branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&branch_value.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void RTree::DFT_recursive(Point q, int k, RTree_node * node, std::vector<d_leaf *> & L, std::vector<float> & ddk,float & poor){
	if(node->is_leaf){
        for(int i = 0; i < node->elements; i++){
            ddk.push_back(node->data_leafs[i].region->distance_geometric(q));
            L.push_back(&node->data_leafs[i]);
        }
        if(ddk.size()>k)
        {
	        insert_sort<d_leaf>(ddk,L);
            ddk.resize(k);
            L.resize(k);
        	poor=ddk[k-1];
        }
    }
    else{
	    std::vector<float> branch_value;
		std::vector<RTree_node *> branch;
        for(int i = 0; i < node->elements; i++){
	        branch_value.push_back(node->data_internal_node[i].region->distance_geometric(q));
            branch.push_back(node->data_internal_node[i].child);
        }
        insert_sort<RTree_node>(branch_value,branch);
		for(int i = 0; i < node->elements; i++){
  	        if(branch_value[i]<=poor){
                DFT_recursive(q,k,branch[i],L,ddk,poor);
            }
        }
      }
}